

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::unwind(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *this)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  chunk *pcVar2;
  chunk *pcVar3;
  
  pcVar3 = this->current_chunk_;
  if (this->current_chunk_ != (chunk *)0x0) {
    while( true ) {
      psVar1 = pcVar3->begin_;
      pcVar2 = pcVar3->back_;
      pcVar3->curr_ = psVar1;
      if (pcVar2 == (chunk *)0x0) break;
      this->current_chunk_ = pcVar2;
      pcVar3 = pcVar2;
    }
    this->curr_ = psVar1;
    this->begin_ = psVar1;
    this->end_ = pcVar3->end_;
  }
  return;
}

Assistant:

void unwind()
    {
        if(this->current_chunk_)
        {
            while(this->current_chunk_->back_)
            {
                this->current_chunk_->curr_ = this->current_chunk_->begin_;
                this->current_chunk_ = this->current_chunk_->back_;
            }

            this->begin_ = this->curr_ = this->current_chunk_->curr_ = this->current_chunk_->begin_;
            this->end_ = this->current_chunk_->end_;
        }
    }